

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall fasttext::DenseMatrix::load(DenseMatrix *this,istream *in)

{
  float *pfVar1;
  char *in_RSI;
  AlignedVector<float> *in_RDI;
  AlignedVector<float> *in_stack_ffffffffffffffb0;
  AlignedVector<float> *this_00;
  
  this_00 = (AlignedVector<float> *)0x8;
  std::istream::read(in_RSI,(long)&in_RDI->size_);
  std::istream::read(in_RSI,(long)(in_RDI + 1));
  intgemm::AlignedVector<float>::AlignedVector
            (in_RDI,(size_t)this_00,(size_t)in_stack_ffffffffffffffb0);
  intgemm::AlignedVector<float>::operator=(this_00,in_stack_ffffffffffffffb0);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1c588c);
  pfVar1 = intgemm::AlignedVector<float>::data((AlignedVector<float> *)&in_RDI[1].size_);
  std::istream::read(in_RSI,(long)pfVar1);
  return;
}

Assistant:

void DenseMatrix::load(std::istream& in) {
  in.read((char*)&m_, sizeof(int64_t));
  in.read((char*)&n_, sizeof(int64_t));
  data_ = intgemm::AlignedVector<real>(m_ * n_);
  in.read((char*)data_.data(), m_ * n_ * sizeof(real));
}